

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QMessagePattern::BacktraceParams>::moveAppend
          (QGenericArrayOps<QMessagePattern::BacktraceParams> *this,BacktraceParams *b,
          BacktraceParams *e)

{
  BacktraceParams *pBVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pBVar1 = (this->super_QArrayDataPointer<QMessagePattern::BacktraceParams>).ptr;
    qVar5 = (this->super_QArrayDataPointer<QMessagePattern::BacktraceParams>).size;
    do {
      pDVar2 = (b->backtraceSeparator).d.d;
      (b->backtraceSeparator).d.d = (Data *)0x0;
      pBVar1[qVar5].backtraceSeparator.d.d = pDVar2;
      pcVar3 = (b->backtraceSeparator).d.ptr;
      (b->backtraceSeparator).d.ptr = (char16_t *)0x0;
      pBVar1[qVar5].backtraceSeparator.d.ptr = pcVar3;
      qVar4 = (b->backtraceSeparator).d.size;
      (b->backtraceSeparator).d.size = 0;
      pBVar1[qVar5].backtraceSeparator.d.size = qVar4;
      pBVar1[qVar5].backtraceDepth = b->backtraceDepth;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<QMessagePattern::BacktraceParams>).size + 1;
      (this->super_QArrayDataPointer<QMessagePattern::BacktraceParams>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }